

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::Properties::load(Properties *this,istream *in,char *name)

{
  long lVar1;
  IOException *pIVar2;
  char cVar3;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string key;
  string value;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ios::exceptions((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  lVar1 = *(long *)(*(long *)in + -0x18);
  if (*(int *)(in + lVar1 + 0x20) != 0) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,(allocator *)&key);
    IOException::IOException(pIVar2,&local_b0.first);
    __cxa_throw(pIVar2,&IOException::typeinfo,Exception::~Exception);
  }
  do {
    if (*(int *)(in + lVar1 + 0x20) != 0) {
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line);
    trim(&line);
    cVar3 = (char)&line;
    lVar1 = std::__cxx11::string::find(cVar3,0x23);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&line);
      std::__cxx11::string::operator=((string *)&line,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (line._M_string_length != 0) {
      lVar1 = std::__cxx11::string::find(cVar3,0x3d);
      if (lVar1 == -1) {
        pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
        std::operator+(&local_b0.first,"Format <key>=<value> expected: ",&line);
        IOException::IOException(pIVar2,&local_b0.first);
        __cxa_throw(pIVar2,&IOException::typeinfo,Exception::~Exception);
      }
      std::__cxx11::string::substr((ulong)&key,(ulong)&line);
      std::__cxx11::string::substr((ulong)&value,(ulong)&line);
      trim(&key);
      trim(&value);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_b0,&key,&value);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this,&local_b0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_b0);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
    }
    lVar1 = *(long *)(*(long *)in + -0x18);
  } while( true );
}

Assistant:

void Properties::load(std::istream &in, const char *name)
{
  std::string line;

  try
  {
    in.exceptions(std::ios_base::badbit);

    if (!in.good())
    {
      throw IOException(name);
    }

    while (in.good())
    {
      getline(in, line);

      trim(line);

      size_t pos=line.find('#');

      if (pos != line.npos)
      {
        line=line.substr(0, pos);
      }

      if (line.size() > 0)
      {
        pos=line.find('=');

        if (pos != line.npos)
        {
          std::string key=line.substr(0, pos);
          std::string value=line.substr(pos+1);

          trim(key);
          trim(value);

          data.insert(std::pair<std::string,std::string>(key, value));
        }
        else
        {
          throw IOException("Format <key>=<value> expected: "+line);
        }
      }
    }
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}